

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shift_reduce_parser.cpp
# Opt level: O0

JsonValue * __thiscall MercuryJson::JSON::_shift_reduce_parsing(JSON *this)

{
  long lVar1;
  JsonObject *pJVar2;
  ulong uVar3;
  bool bVar4;
  reference this_00;
  reference this_01;
  size_t sVar5;
  JsonPartialValue *value_00;
  JsonPartialValue *pJVar6;
  JsonValue *pJVar7;
  long in_RDI;
  undefined1 *puVar8;
  JSON *unaff_retaddr;
  JsonValue *ret;
  char ch;
  JsonPartialArrayHead *prev_arr;
  JsonPartialObjectHead *prev_obj;
  JsonPartialValue *value;
  size_t idx;
  ParseStack *merge_stack;
  int i_3;
  ParseStack *main_stack;
  size_t idx_end;
  size_t idx_end_1;
  size_t idx_begin;
  int i_2;
  int i_1;
  int i;
  size_t num_indices_per_thread;
  vector<MercuryJson::shift_reduce_impl::ParseStack,_std::allocator<MercuryJson::shift_reduce_impl::ParseStack>_>
  stacks;
  vector<MercuryJson::BlockAllocator<MercuryJson::JsonValue>,_std::allocator<MercuryJson::BlockAllocator<MercuryJson::JsonValue>_>_>
  allocators;
  thread shift_reduce_threads [3];
  undefined7 in_stack_fffffffffffffde8;
  char in_stack_fffffffffffffdef;
  char args_1;
  ParseStack *in_stack_fffffffffffffdf0;
  ValueType args;
  BlockAllocator<MercuryJson::JsonValue> *in_stack_fffffffffffffdf8;
  vector<MercuryJson::BlockAllocator<MercuryJson::JsonValue>,_std::allocator<MercuryJson::BlockAllocator<MercuryJson::JsonValue>_>_>
  *in_stack_fffffffffffffe00;
  ParseStack *in_stack_fffffffffffffe08;
  undefined1 *puVar9;
  BlockAllocator<MercuryJson::JsonValue> *in_stack_fffffffffffffe10;
  ParseStack **in_stack_fffffffffffffe18;
  vector<MercuryJson::BlockAllocator<MercuryJson::JsonValue>,_std::allocator<MercuryJson::BlockAllocator<MercuryJson::JsonValue>_>_>
  *in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe2c;
  JSON **in_stack_fffffffffffffe30;
  undefined7 in_stack_fffffffffffffe38;
  undefined1 in_stack_fffffffffffffe3f;
  JSON *in_stack_fffffffffffffe40;
  undefined1 *local_158;
  ulong local_128;
  int local_114;
  int local_b8;
  int local_b4;
  BlockAllocator<MercuryJson::JsonValue> local_b0;
  int local_74;
  ulong local_70;
  vector<MercuryJson::shift_reduce_impl::ParseStack,_std::allocator<MercuryJson::shift_reduce_impl::ParseStack>_>
  local_68;
  vector<MercuryJson::BlockAllocator<MercuryJson::JsonValue>,_std::allocator<MercuryJson::BlockAllocator<MercuryJson::JsonValue>_>_>
  local_40;
  undefined1 local_28 [16];
  size_t in_stack_ffffffffffffffe8;
  undefined1 local_10 [7];
  char *in_stack_fffffffffffffff8;
  
  local_158 = local_28;
  _local_10 = in_RDI;
  do {
    std::thread::thread((thread *)0x136283);
    local_158 = local_158 + 8;
  } while (local_158 != local_10);
  std::
  vector<MercuryJson::BlockAllocator<MercuryJson::JsonValue>,_std::allocator<MercuryJson::BlockAllocator<MercuryJson::JsonValue>_>_>
  ::vector((vector<MercuryJson::BlockAllocator<MercuryJson::JsonValue>,_std::allocator<MercuryJson::BlockAllocator<MercuryJson::JsonValue>_>_>
            *)0x1362b9);
  std::
  vector<MercuryJson::BlockAllocator<MercuryJson::JsonValue>,_std::allocator<MercuryJson::BlockAllocator<MercuryJson::JsonValue>_>_>
  ::reserve(in_stack_fffffffffffffe20,(size_type)in_stack_fffffffffffffe18);
  std::
  vector<MercuryJson::shift_reduce_impl::ParseStack,_std::allocator<MercuryJson::shift_reduce_impl::ParseStack>_>
  ::vector((vector<MercuryJson::shift_reduce_impl::ParseStack,_std::allocator<MercuryJson::shift_reduce_impl::ParseStack>_>
            *)0x1362e2);
  std::
  vector<MercuryJson::shift_reduce_impl::ParseStack,_std::allocator<MercuryJson::shift_reduce_impl::ParseStack>_>
  ::reserve((vector<MercuryJson::shift_reduce_impl::ParseStack,_std::allocator<MercuryJson::shift_reduce_impl::ParseStack>_>
             *)in_stack_fffffffffffffe20,(size_type)in_stack_fffffffffffffe18);
  std::
  vector<MercuryJson::shift_reduce_impl::ParseStack,std::allocator<MercuryJson::shift_reduce_impl::ParseStack>>
  ::emplace_back<MercuryJson::BlockAllocator<MercuryJson::JsonValue>&>
            ((vector<MercuryJson::shift_reduce_impl::ParseStack,_std::allocator<MercuryJson::shift_reduce_impl::ParseStack>_>
              *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  local_70 = *(long *)(in_RDI + 0x10) + 3U >> 2;
  for (local_74 = 0; local_74 < 3; local_74 = local_74 + 1) {
    BlockAllocator<MercuryJson::JsonValue>::fork(&local_b0);
    std::
    vector<MercuryJson::BlockAllocator<MercuryJson::JsonValue>,_std::allocator<MercuryJson::BlockAllocator<MercuryJson::JsonValue>_>_>
    ::push_back((vector<MercuryJson::BlockAllocator<MercuryJson::JsonValue>,_std::allocator<MercuryJson::BlockAllocator<MercuryJson::JsonValue>_>_>
                 *)in_stack_fffffffffffffdf0,
                (value_type *)CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8));
    BlockAllocator<MercuryJson::JsonValue>::~BlockAllocator(in_stack_fffffffffffffe10);
  }
  for (local_b4 = 0; local_b4 < 3; local_b4 = local_b4 + 1) {
    std::
    vector<MercuryJson::BlockAllocator<MercuryJson::JsonValue>,_std::allocator<MercuryJson::BlockAllocator<MercuryJson::JsonValue>_>_>
    ::operator[](&local_40,(long)local_b4);
    std::
    vector<MercuryJson::shift_reduce_impl::ParseStack,std::allocator<MercuryJson::shift_reduce_impl::ParseStack>>
    ::emplace_back<MercuryJson::BlockAllocator<MercuryJson::JsonValue>&>
              ((vector<MercuryJson::shift_reduce_impl::ParseStack,_std::allocator<MercuryJson::shift_reduce_impl::ParseStack>_>
                *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  }
  for (local_b8 = 0; local_b8 < 3; local_b8 = local_b8 + 1) {
    std::
    vector<MercuryJson::shift_reduce_impl::ParseStack,_std::allocator<MercuryJson::shift_reduce_impl::ParseStack>_>
    ::operator[](&local_68,(long)(local_b8 + 1));
    std::thread::
    thread<void(MercuryJson::JSON::*)(unsigned_long_const*,unsigned_long_const*,MercuryJson::shift_reduce_impl::ParseStack*),MercuryJson::JSON*,unsigned_long*,unsigned_long*,MercuryJson::shift_reduce_impl::ParseStack*,void>
              ((thread *)in_stack_fffffffffffffe40,
               (type *)CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38),
               in_stack_fffffffffffffe30,
               (unsigned_long **)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
               (unsigned_long **)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
    std::thread::operator=
              ((thread *)in_stack_fffffffffffffdf0,
               (thread *)CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8));
    std::thread::~thread((thread *)0x136595);
  }
  std::
  vector<MercuryJson::shift_reduce_impl::ParseStack,_std::allocator<MercuryJson::shift_reduce_impl::ParseStack>_>
  ::operator[](&local_68,0);
  _thread_shift_reduce_parsing
            (in_stack_fffffffffffffe40,
             (size_t *)CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38),
             (size_t *)in_stack_fffffffffffffe30,
             (ParseStack *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  this_00 = std::
            vector<MercuryJson::shift_reduce_impl::ParseStack,_std::allocator<MercuryJson::shift_reduce_impl::ParseStack>_>
            ::operator[](&local_68,0);
  local_114 = 0;
  do {
    if (2 < local_114) {
      sVar5 = shift_reduce_impl::ParseStack::size(this_00);
      if (sVar5 != 1) {
        __assert_fail("main_stack.size() == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/Somefive[P]MercuryJson/src/shift_reduce_parser.cpp"
                      ,0x208,"JsonValue *MercuryJson::JSON::_shift_reduce_parsing()");
      }
      pJVar7 = (JsonValue *)shift_reduce_impl::ParseStack::operator[](this_00,0);
      *(long *)(in_RDI + 0x20) = (*(long *)(in_RDI + 0x10) + -1) * 8 + *(long *)(in_RDI + 0x20);
      std::
      vector<MercuryJson::shift_reduce_impl::ParseStack,_std::allocator<MercuryJson::shift_reduce_impl::ParseStack>_>
      ::~vector((vector<MercuryJson::shift_reduce_impl::ParseStack,_std::allocator<MercuryJson::shift_reduce_impl::ParseStack>_>
                 *)in_stack_fffffffffffffe00);
      std::
      vector<MercuryJson::BlockAllocator<MercuryJson::JsonValue>,_std::allocator<MercuryJson::BlockAllocator<MercuryJson::JsonValue>_>_>
      ::~vector(in_stack_fffffffffffffe00);
      puVar9 = local_28;
      puVar8 = local_10;
      do {
        puVar8 = puVar8 + -8;
        std::thread::~thread((thread *)0x136ae3);
      } while (puVar8 != puVar9);
      return pJVar7;
    }
    std::thread::join();
    this_01 = std::
              vector<MercuryJson::shift_reduce_impl::ParseStack,_std::allocator<MercuryJson::shift_reduce_impl::ParseStack>_>
              ::operator[](&local_68,(long)(local_114 + 1));
    for (local_128 = 0; sVar5 = shift_reduce_impl::ParseStack::size(this_01), local_128 < sVar5;
        local_128 = local_128 + 1) {
      value_00 = shift_reduce_impl::ParseStack::operator[](this_01,local_128);
      args_1 = (char)((ulong)in_stack_fffffffffffffdf0 >> 0x18);
      args = (ValueType)((ulong)in_stack_fffffffffffffdf0 >> 0x20);
      switch(value_00->type) {
      case TYPE_NULL:
      case TYPE_BOOL:
      case TYPE_STR:
      case TYPE_OBJ:
      case TYPE_ARR:
      case TYPE_INT:
      case TYPE_DEC:
        shift_reduce_impl::ParseStack::push(this_00,value_00);
        break;
      case TYPE_PARTIAL_OBJ:
        bVar4 = shift_reduce_impl::ParseStack::
                check<MercuryJson::shift_reduce_impl::JsonPartialValue::ValueType,char>
                          ((ParseStack *)in_stack_fffffffffffffdf8,args,args_1);
        if (bVar4) {
          pJVar6 = shift_reduce_impl::ParseStack::get(this_00,2);
          lVar1 = (pJVar6->field_1).integer;
          *(anon_union_8_9_cf323b4b_for_JsonPartialValue_2 *)(*(long *)(lVar1 + 0x18) + 0x10) =
               value_00->field_1;
          *(undefined8 *)(lVar1 + 0x18) = *(undefined8 *)((value_00->field_1).integer + 0x18);
          shift_reduce_impl::ParseStack::pop(this_00,1);
        }
        else {
          shift_reduce_impl::ParseStack::push(this_00,value_00);
        }
        break;
      case TYPE_PARTIAL_ARR:
        bVar4 = shift_reduce_impl::ParseStack::
                check<MercuryJson::shift_reduce_impl::JsonPartialValue::ValueType,char>
                          ((ParseStack *)in_stack_fffffffffffffdf8,args,args_1);
        if (bVar4) {
          pJVar6 = shift_reduce_impl::ParseStack::get(this_00,2);
          pJVar2 = (pJVar6->field_1).object;
          pJVar2->next->value = (JsonValue *)value_00->field_1;
          pJVar2->next = ((value_00->field_1).object)->next;
          shift_reduce_impl::ParseStack::pop(this_00,1);
        }
        else {
          shift_reduce_impl::ParseStack::push(this_00,value_00);
        }
        break;
      case TYPE_CHAR:
        bVar4 = (value_00->field_1).boolean;
        if (bVar4 == true) {
          shift_reduce_impl::ParseStack::reduce_partial_array
                    ((ParseStack *)in_stack_fffffffffffffe10);
        }
        else if ((bVar4 == true) || (bVar4 == true)) {
LAB_00136913:
          shift_reduce_impl::ParseStack::push<char>
                    (in_stack_fffffffffffffdf0,in_stack_fffffffffffffdef);
        }
        else if (bVar4 == true) {
          shift_reduce_impl::ParseStack::reduce_array((ParseStack *)in_stack_fffffffffffffe10);
        }
        else {
          if (bVar4 == true) goto LAB_00136913;
          if (bVar4 != true) {
            uVar3 = (ulong)_local_10 >> 0x38;
            _error(unaff_retaddr,in_stack_fffffffffffffff8,(char)uVar3,in_stack_ffffffffffffffe8);
          }
          shift_reduce_impl::ParseStack::reduce_object(in_stack_fffffffffffffdf0);
        }
      }
      do {
        bVar4 = shift_reduce_impl::ParseStack::reduce_partial_object(in_stack_fffffffffffffe08);
      } while (bVar4);
    }
    local_114 = local_114 + 1;
  } while( true );
}

Assistant:

JsonValue *JSON::_shift_reduce_parsing() {
        using shift_reduce_impl::JsonPartialValue;
        using shift_reduce_impl::JsonPartialObjectHead;
        using shift_reduce_impl::JsonPartialArrayHead;
        using shift_reduce_impl::ParseStack;

#if SHIFT_REDUCE_NUM_THREADS > 1
        std::thread shift_reduce_threads[SHIFT_REDUCE_NUM_THREADS - 1];
        std::vector<BlockAllocator<JsonValue>> allocators;
        allocators.reserve(SHIFT_REDUCE_NUM_THREADS - 1);
        std::vector<ParseStack> stacks;
        stacks.reserve(SHIFT_REDUCE_NUM_THREADS);
        stacks.emplace_back(allocator);
        size_t num_indices_per_thread = (num_indices - 1 + SHIFT_REDUCE_NUM_THREADS) / SHIFT_REDUCE_NUM_THREADS;
        for (int i = 0; i < SHIFT_REDUCE_NUM_THREADS - 1; ++i)
            allocators.push_back(allocator.fork(2 * num_indices_per_thread * sizeof(JsonPartialValue)));
        for (int i = 0; i < SHIFT_REDUCE_NUM_THREADS - 1; ++i)
            stacks.emplace_back(allocators[i]);
        for (int i = 0; i < SHIFT_REDUCE_NUM_THREADS - 1; ++i) {
            size_t idx_begin = (num_indices - 1) * (i + 1) / SHIFT_REDUCE_NUM_THREADS;
            size_t idx_end = (num_indices - 1) * (i + 2) / SHIFT_REDUCE_NUM_THREADS;
            shift_reduce_threads[i] = std::thread(&JSON::_thread_shift_reduce_parsing, this,
                                                  indices + idx_begin, indices + idx_end, &stacks[i + 1]);
        }
        size_t idx_end = (num_indices - 1) / SHIFT_REDUCE_NUM_THREADS;
        _thread_shift_reduce_parsing(indices, indices + idx_end, &stacks[0]);

        // Join threads and merge.
        ParseStack &main_stack = stacks[0];
//        main_stack.print();
        for (int i = 0; i < SHIFT_REDUCE_NUM_THREADS - 1; ++i) {
            shift_reduce_threads[i].join();
            ParseStack &merge_stack = stacks[i + 1];
//            merge_stack.print();
            for (size_t idx = 0; idx < merge_stack.size(); ++idx) {
                auto *value = merge_stack[idx];
                switch (value->type) {
                    case JsonPartialValue::TYPE_NULL:
                    case JsonPartialValue::TYPE_BOOL:
                    case JsonPartialValue::TYPE_STR:
                    case JsonPartialValue::TYPE_OBJ:
                    case JsonPartialValue::TYPE_ARR:
                    case JsonPartialValue::TYPE_INT:
                    case JsonPartialValue::TYPE_DEC:
                        main_stack.push(value);
                        break;
                    case JsonPartialValue::TYPE_PARTIAL_OBJ:
                        if (main_stack.check(JsonPartialValue::TYPE_PARTIAL_OBJ, ',')) {
                            // Merge with partial object from previous stack.
                            auto *prev_obj = static_cast<JsonPartialObjectHead *>(main_stack.get(2)->partial_object);
                            prev_obj->final->next = value->partial_object;
                            prev_obj->final = static_cast<JsonPartialObjectHead *>(value->partial_object)->final;
                            main_stack.pop(1);
                        } else {
                            main_stack.push(value);
                        }
                        break;
                    case JsonPartialValue::TYPE_PARTIAL_ARR:
                        if (main_stack.check(JsonPartialValue::TYPE_PARTIAL_ARR, ',')) {
                            // Merge with partial array from previous stack.
                            auto *prev_arr = static_cast<JsonPartialArrayHead *>(main_stack.get(2)->partial_array);
                            prev_arr->final->next = value->partial_array;
                            prev_arr->final = static_cast<JsonPartialArrayHead *>(value->partial_array)->final;
                            main_stack.pop(1);
                        } else {
                            main_stack.push(value);
                        }
                        break;
                    case JsonPartialValue::TYPE_CHAR:
                        switch (char ch = value->structural) {
                            case '{':
                            case '[':
                            case ':':
                                main_stack.push(ch);
                                break;

                                // Perform reduce on the stack.
                                // There will be at most two consecutive reduce ops:
                                //   1. From a partial array to array, or from a partial object to object.
                                //   2. Merge the previously constructed value with a partial array or partial object.
                            case '}':
                                // "{", partial-object, "}"  =>  object
                                main_stack.reduce_object();
                                break;
                            case ']':
                                // "[", partial-array, "]"  =>  array
                                main_stack.reduce_array();
                                break;
                            case ',':
                                // value, ","  =>  partial-array
                                main_stack.reduce_partial_array();
                                break;
                            default:
                                error("JSON value");
                        }
                        break;
                }
                while (main_stack.reduce_partial_object()) {}
            }
        }
#else
        ParseStack main_stack(allocator);
        _thread_shift_reduce_parsing(indices, indices + num_indices - 1, &main_stack);
#endif
//        main_stack.print();
        assert(main_stack.size() == 1);
        auto *ret = reinterpret_cast<JsonValue *>(main_stack[0]);
        idx_ptr += num_indices - 1;  // Consume the indices to satisfy null ending check.

        return ret;
    }